

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O1

void __thiscall TApp_RequiresMultiFlags_Test::TestBody(TApp_RequiresMultiFlags_Test *this)

{
  input_t *piVar1;
  TApp *pTVar2;
  bool bVar3;
  Option *opt;
  Option *opt_00;
  Option *this_00;
  long lVar4;
  App *this_01;
  AssertHelper AStack_1c8;
  TApp *local_1c0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [16];
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  Option *local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"--opt1","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  this_01 = &(this->super_TApp).app;
  local_1c0 = &this->super_TApp;
  local_138 = CLI::App::add_flag(this_01,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--opt2","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  opt = CLI::App::add_flag(this_01,&local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"--opt3","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  opt_00 = CLI::App::add_flag(this_01,&local_d0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"--optall","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  this_00 = CLI::App::add_flag(this_01,&local_110,&local_130);
  CLI::Option::requires(this_00,local_138);
  CLI::Option::requires(this_00,opt);
  CLI::Option::requires(this_00,opt_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  pTVar2 = local_1c0;
  TApp::run(local_1c0);
  CLI::App::reset(this_01);
  local_1b8[0].ptr_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"--opt1","");
  piVar1 = &pTVar2->args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b8,
             local_198);
  if (local_1b8[0].ptr_ != local_1a8) {
    operator_delete(local_1b8[0].ptr_);
  }
  TApp::run(pTVar2);
  CLI::App::reset(this_01);
  local_1b8[0].ptr_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"--opt2","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b8,
             local_198);
  if (local_1b8[0].ptr_ != local_1a8) {
    operator_delete(local_1b8[0].ptr_);
  }
  TApp::run(pTVar2);
  CLI::App::reset(this_01);
  local_1b8[0].ptr_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"--optall","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b8,
             (string *)local_198);
  if (local_1b8[0].ptr_ != local_1a8) {
    operator_delete(local_1b8[0].ptr_);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    TApp::run(pTVar2);
  }
  testing::Message::Message((Message *)local_1b8);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_1c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x42e,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_1c8,(Message *)local_1b8);
  testing::internal::AssertHelper::~AssertHelper(&AStack_1c8);
  if (local_1b8[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       (local_1b8[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_1b8[0].ptr_ + 8))();
    }
    local_1b8[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  CLI::App::reset(this_01);
  local_1b8[0].ptr_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"--optall","");
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"--opt1","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b8,
             local_178);
  lVar4 = 0;
  do {
    if (local_188 + lVar4 != *(undefined1 **)((long)local_198 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_198 + lVar4));
    }
    pTVar2 = local_1c0;
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x40);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    TApp::run(pTVar2);
  }
  testing::Message::Message((Message *)local_1b8);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_1c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x432,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_1c8,(Message *)local_1b8);
  testing::internal::AssertHelper::~AssertHelper(&AStack_1c8);
  if (local_1b8[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       (local_1b8[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_1b8[0].ptr_ + 8))();
    }
    local_1b8[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  CLI::App::reset(this_01);
  local_1b8[0].ptr_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"--optall","");
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"--opt2","");
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"--opt1","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b8,
             local_158);
  lVar4 = 0;
  do {
    if (local_168 + lVar4 != *(undefined1 **)((long)local_178 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_178 + lVar4));
    }
    pTVar2 = local_1c0;
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x60);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    TApp::run(pTVar2);
  }
  testing::Message::Message((Message *)local_1b8);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_1c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x436,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_1c8,(Message *)local_1b8);
  testing::internal::AssertHelper::~AssertHelper(&AStack_1c8);
  if (local_1b8[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       (local_1b8[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_1b8[0].ptr_ + 8))();
    }
    local_1b8[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  CLI::App::reset(this_01);
  local_1b8[0].ptr_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"--optall","");
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"--opt1","");
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"--opt2","");
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"--opt3","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b8,
             &local_138);
  lVar4 = 0;
  do {
    if (local_148 + lVar4 != *(undefined1 **)((long)local_158 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_158 + lVar4));
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x80);
  TApp::run(local_1c0);
  return;
}

Assistant:

TEST_F(TApp, RequiresMultiFlags) {
    CLI::Option *opt1 = app.add_flag("--opt1");
    CLI::Option *opt2 = app.add_flag("--opt2");
    CLI::Option *opt3 = app.add_flag("--opt3");
    app.add_flag("--optall")->requires(opt1, opt2, opt3);

    run();

    app.reset();
    args = {"--opt1"};
    run();

    app.reset();
    args = {"--opt2"};
    run();

    app.reset();
    args = {"--optall"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt1"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt2", "--opt1"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt1", "--opt2", "--opt3"};
    run();
}